

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O3

void h265e_code_slice_header(H265eSlice *slice,MppWriteCtx *bitIf,RK_U32 slice_segment_addr)

{
  H265eReferencePictureSet *rps;
  RK_U32 RVar1;
  SliceType SVar2;
  ulong uVar3;
  RK_S32 *pRVar4;
  H265ePps *pHVar5;
  int iVar6;
  RK_U32 RVar7;
  int len;
  uint uVar8;
  uint uVar9;
  int iVar10;
  RK_U32 RVar11;
  H265eSps *pHVar12;
  long lVar13;
  long lVar14;
  RK_S32 RVar15;
  RK_S32 *pRVar16;
  bool bVar17;
  RK_S32 ltrpInSPS [16];
  RK_S32 aRStack_78 [18];
  
  pHVar12 = slice->m_sps;
  uVar9 = pHVar12->m_maxCUSize;
  RVar11 = pHVar12->m_picWidthInLumaSamples;
  RVar7 = pHVar12->m_picHeightInLumaSamples;
  mpp_writer_put_bits(bitIf,(uint)(slice_segment_addr == 0),1);
  mpp_writer_put_ue(bitIf,slice->m_ppsId);
  if (slice_segment_addr != 0) {
    iVar6 = -1;
    do {
      iVar6 = iVar6 + 1;
    } while ((uint)(1 << ((byte)iVar6 & 0x1f)) <
             (((uVar9 - 1) + RVar7) / uVar9) * ((RVar11 + (uVar9 - 1)) / uVar9));
    mpp_writer_put_bits(bitIf,slice_segment_addr,iVar6);
  }
  rps = slice->m_rps;
  slice->m_enableTMVPFlag = 0;
  if (slice->m_dependentSliceSegmentFlag != 0) goto LAB_001cb8ed;
  if (slice->m_pps->m_numExtraSliceHeaderBits != 0) {
    uVar9 = 0;
    do {
      mpp_writer_put_bits(bitIf,(uint)((slice->slice_reserved_flag >> (uVar9 & 0x1f) & 1) != 0),1);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (uint)slice->m_pps->m_numExtraSliceHeaderBits);
  }
  mpp_writer_put_ue(bitIf,slice->m_sliceType);
  if (slice->m_pps->m_outputFlagPresentFlag != 0) {
    mpp_writer_put_bits(bitIf,(uint)(slice->m_picOutputFlag != 0),1);
  }
  pHVar12 = slice->m_sps;
  if (slice->m_sliceType != I_SLICE) {
    iVar6 = 1 << ((byte)pHVar12->m_bitsForPOC & 0x1f);
    mpp_writer_put_bits(bitIf,((slice->poc - slice->last_idr) + iVar6) % iVar6,pHVar12->m_bitsForPOC
                       );
    if (slice->m_bdIdx < 0) {
      mpp_writer_put_bits(bitIf,0,1);
      code_st_refpic_set(bitIf,rps,(slice->m_sps->m_RPSList).m_numberOfReferencePictureSets);
    }
    else {
      mpp_writer_put_bits(bitIf,1,1);
      iVar6 = -1;
      do {
        iVar6 = iVar6 + 1;
      } while (1 << ((byte)iVar6 & 0x1f) < (slice->m_sps->m_RPSList).m_numberOfReferencePictureSets)
      ;
      if (iVar6 != 0) {
        mpp_writer_put_bits(bitIf,slice->m_bdIdx,iVar6);
      }
    }
    pHVar12 = slice->m_sps;
    if (pHVar12->m_bLongTermRefsPresent != 0) {
      RVar11 = rps->num_long_term_pic;
      if ((int)RVar11 < 1) {
        uVar9 = pHVar12->m_numLongTermRefPicSPS;
        iVar6 = 0;
        RVar7 = 0;
      }
      else {
        iVar10 = rps->m_numberOfPictures;
        lVar13 = (long)iVar10;
        RVar1 = pHVar12->m_bitsForPOC;
        uVar9 = pHVar12->m_numLongTermRefPicSPS;
        RVar7 = 0;
        iVar6 = 0;
        do {
          if (uVar9 != 0) {
            uVar3 = 0;
            do {
              if (((int)rps->m_ref[lVar13 + 0xf] % (1 << ((byte)RVar1 & 0x1f)) ==
                   pHVar12->m_ltRefPicPocLsbSps[uVar3]) &&
                 (pHVar12->m_usedByCurrPicLtSPSFlag[uVar3] == rps->delta_poc[lVar13 + 0xf])) {
                aRStack_78[(int)RVar7] = (RK_S32)uVar3;
                RVar7 = RVar7 + 1;
                goto LAB_001cbb56;
              }
              uVar3 = uVar3 + 1;
            } while (uVar9 != uVar3);
          }
          iVar6 = iVar6 + 1;
LAB_001cbb56:
          lVar13 = lVar13 + -1;
        } while ((int)(iVar10 - RVar11) < lVar13);
      }
      iVar10 = -1;
      do {
        iVar10 = iVar10 + 1;
      } while ((uint)(1 << ((byte)iVar10 & 0x1f)) < uVar9);
      if (uVar9 != 0) {
        mpp_writer_put_ue(bitIf,RVar7);
      }
      mpp_writer_put_ue(bitIf,RVar11);
      lVar13 = (long)rps->num_positive_pic + (long)rps->num_negative_pic;
      lVar14 = (long)rps->m_numberOfPictures;
      if ((int)lVar13 < rps->m_numberOfPictures) {
        pRVar16 = rps->delta_poc + lVar14 + 0xf;
        RVar15 = 0;
        do {
          if (iVar6 < (int)RVar7) {
            pRVar4 = aRStack_78 + iVar6;
            len = iVar10;
            if (iVar10 != 0) goto LAB_001cbc3f;
          }
          else {
            mpp_writer_put_bits(bitIf,pRVar16[-0x43],slice->m_sps->m_bitsForPOC);
            len = 1;
            pRVar4 = pRVar16;
LAB_001cbc3f:
            mpp_writer_put_bits(bitIf,*pRVar4,len);
          }
          mpp_writer_put_bits(bitIf,pRVar16[-0x23],1);
          if (pRVar16[-0x23] != 0) {
            if ((int)lVar14 + -1 == ~RVar7 + rps->m_numberOfPictures) {
              RVar15 = 0;
            }
            if ((int)lVar14 == rps->m_numberOfPictures) {
              RVar15 = 0;
            }
            mpp_writer_put_ue(bitIf,pRVar16[-0x33] - RVar15);
            RVar15 = pRVar16[-0x33];
          }
          lVar14 = lVar14 + -1;
          pRVar16 = pRVar16 + -1;
        } while (lVar13 < lVar14);
      }
      pHVar12 = slice->m_sps;
    }
    if (pHVar12->m_TMVPFlagsPresent != 0) {
      mpp_writer_put_bits(bitIf,(uint)(slice->m_enableTMVPFlag != 0),1);
      pHVar12 = slice->m_sps;
    }
  }
  if (pHVar12->m_bUseSAO != 0) {
    mpp_writer_put_bits(bitIf,0,1);
    mpp_writer_put_bits(bitIf,0,1);
  }
  if ((slice->m_sliceType != I_SLICE) &&
     (RVar11 = slice->m_numRefIdx[0], RVar7 = slice->m_pps->m_numRefIdxL0DefaultActive,
     mpp_writer_put_bits(bitIf,(uint)(RVar11 != RVar7),1), RVar11 != RVar7)) {
    mpp_writer_put_ue(bitIf,slice->m_numRefIdx[0] - 1);
    slice->m_numRefIdx[1] = 0;
  }
  if ((slice->m_pps->m_listsModificationPresentFlag != 0) &&
     (iVar6 = rps->num_positive_pic + rps->num_negative_pic, uVar9 = iVar6 + rps->num_long_term_pic,
     uVar9 != 0 && SCARRY4(iVar6,rps->num_long_term_pic) == (int)uVar9 < 0)) {
    uVar3 = 0;
    uVar8 = 0;
    do {
      uVar8 = (uVar8 + 1) - (uint)(rps->m_used[uVar3] == 0);
      uVar3 = uVar3 + 1;
    } while (uVar9 != uVar3);
    if (((1 < uVar8) &&
        (mpp_writer_put_bits(bitIf,(uint)((slice->m_RefPicListModification).
                                          m_refPicListModificationFlagL0 != 0),1),
        (slice->m_RefPicListModification).m_refPicListModificationFlagL0 != 0)) &&
       (iVar6 = rps->num_positive_pic + rps->num_negative_pic,
       uVar9 = iVar6 + rps->num_long_term_pic,
       uVar9 != 0 && SCARRY4(iVar6,rps->num_long_term_pic) == (int)uVar9 < 0)) {
      uVar3 = 0;
      uVar8 = 0;
      do {
        uVar8 = (uVar8 + 1) - (uint)(rps->m_used[uVar3] == 0);
        uVar3 = uVar3 + 1;
      } while (uVar9 != uVar3);
      if (1 < uVar8) {
        iVar6 = 1;
        if (uVar8 != 2) {
          uVar9 = uVar8 - 1;
          do {
            iVar6 = iVar6 + 1;
            bVar17 = 3 < uVar9;
            uVar9 = uVar9 >> 1;
          } while (bVar17);
        }
        if (slice->m_numRefIdx[0] != 0) {
          uVar3 = 0;
          do {
            mpp_writer_put_bits(bitIf,(slice->m_RefPicListModification).m_RefPicSetIdxL0[uVar3],
                                iVar6);
            uVar3 = uVar3 + 1;
          } while (uVar3 < (uint)slice->m_numRefIdx[0]);
        }
      }
    }
  }
  if (slice->m_pps->m_cabacInitPresentFlag != 0) {
    mpp_writer_put_bits(bitIf,slice->m_cabacInitFlag,1);
  }
  SVar2 = slice->m_sliceType;
  if (slice->m_enableTMVPFlag == 0) {
LAB_001cbeda:
    if (SVar2 != I_SLICE) {
LAB_001cbedf:
      RVar11 = 4;
      if (slice->m_maxNumMergeCand != 0) {
        RVar11 = 5 - slice->m_maxNumMergeCand;
      }
      mpp_writer_put_ue(bitIf,RVar11);
    }
  }
  else if (SVar2 != I_SLICE) {
    if (slice->m_colFromL0Flag == 0) {
      iVar6 = slice->m_numRefIdx[1];
joined_r0x001cbec2:
      if (1 < iVar6) {
        mpp_writer_put_ue(bitIf,slice->m_colRefIdx);
        SVar2 = slice->m_sliceType;
        goto LAB_001cbeda;
      }
    }
    else if (slice->m_colFromL0Flag == 1) {
      iVar6 = slice->m_numRefIdx[0];
      goto joined_r0x001cbec2;
    }
    goto LAB_001cbedf;
  }
  mpp_writer_put_se(bitIf,(slice->m_sliceQp - slice->m_pps->m_picInitQPMinus26) + -0x1a);
  pHVar5 = slice->m_pps;
  if (pHVar5->m_bSliceChromaQpFlag != 0) {
    mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCb);
    mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCr);
    pHVar5 = slice->m_pps;
  }
  if (pHVar5->m_deblockingFilterControlPresentFlag != 0) {
    if (pHVar5->m_deblockingFilterOverrideEnabledFlag != 0) {
      mpp_writer_put_bits(bitIf,slice->m_deblockingFilterOverrideFlag,1);
    }
    if ((slice->m_deblockingFilterOverrideFlag != 0) &&
       (mpp_writer_put_bits(bitIf,slice->m_deblockingFilterDisable,1),
       slice->m_deblockingFilterDisable == 0)) {
      mpp_writer_put_se(bitIf,slice->m_deblockingFilterBetaOffsetDiv2);
      mpp_writer_put_se(bitIf,slice->m_deblockingFilterTcOffsetDiv2);
    }
  }
LAB_001cb8ed:
  pHVar5 = slice->m_pps;
  if (pHVar5->m_tiles_enabled_flag != 0) {
    mpp_writer_put_ue(bitIf,0);
    pHVar5 = slice->m_pps;
  }
  if ((pHVar5->m_sliceHeaderExtensionPresentFlag != 0) &&
     (mpp_writer_put_ue(bitIf,slice->slice_header_extension_length),
     slice->slice_header_extension_length != 0)) {
    uVar9 = 0;
    do {
      mpp_writer_put_bits(bitIf,0,8);
      uVar9 = uVar9 + 1;
    } while (uVar9 < slice->slice_header_extension_length);
  }
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_header");
  return;
}

Assistant:

void h265e_code_slice_header(H265eSlice *slice, MppWriteCtx *bitIf,
                             RK_U32 slice_segment_addr)
{
    RK_U32 i = 0;
    RK_U32 slice_address_addr_bits = 0;
    H265eSps *sps = slice->m_sps;
    RK_U32 pic_width_in_ctb = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) /
                              sps->m_maxCUSize;
    RK_U32 pic_height_in_ctb = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) /
                               sps->m_maxCUSize;
    RK_U32 max_ctu_num = pic_width_in_ctb * pic_height_in_ctb;

    mpp_writer_put_bits(bitIf, (slice_segment_addr == 0), 1); //first_slice_segment_in_pic_flag
    mpp_writer_put_ue(bitIf, slice->m_ppsId);

    if (slice_segment_addr != 0) {
        while (max_ctu_num > (RK_U32)(1 << slice_address_addr_bits)) {
            slice_address_addr_bits++;
        }
        //slice_segment_address
        mpp_writer_put_bits(bitIf, slice_segment_addr, slice_address_addr_bits);
    }

    H265eReferencePictureSet* rps = slice->m_rps;
    slice->m_enableTMVPFlag = 0;
    if (!slice->m_dependentSliceSegmentFlag) {
        for (i = 0; i < (RK_U32)slice->m_pps->m_numExtraSliceHeaderBits; i++) {
            mpp_writer_put_bits(bitIf, (slice->slice_reserved_flag >> i) & 0x1, 1);
        }

        mpp_writer_put_ue(bitIf, slice->m_sliceType);

        if (slice->m_pps->m_outputFlagPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_picOutputFlag ? 1 : 0, 1);
        }

        if (slice->m_sliceType != I_SLICE) { // skip frame can't iDR
            RK_S32 picOrderCntLSB = (slice->poc - slice->last_idr + (1 << slice->m_sps->m_bitsForPOC)) % (1 << slice->m_sps->m_bitsForPOC);
            mpp_writer_put_bits(bitIf, picOrderCntLSB, slice->m_sps->m_bitsForPOC);
            if (slice->m_bdIdx < 0) {
                mpp_writer_put_bits(bitIf, 0, 1);
                code_st_refpic_set(bitIf, rps, slice->m_sps->m_RPSList.m_numberOfReferencePictureSets);
            } else {
                mpp_writer_put_bits(bitIf, 1, 1);
                RK_S32 numBits = 0;
                while ((1 << numBits) < slice->m_sps->m_RPSList.m_numberOfReferencePictureSets) {
                    numBits++;
                }

                if (numBits > 0) {
                    mpp_writer_put_bits(bitIf, slice->m_bdIdx, numBits);
                }
            }
            if (slice->m_sps->m_bLongTermRefsPresent) {

                RK_S32 numLtrpInSH = rps->m_numberOfPictures;
                RK_S32 ltrpInSPS[MAX_REFS];
                RK_S32 numLtrpInSPS = 0;
                RK_U32 ltrpIndex;
                RK_S32 counter = 0;
                RK_S32 k;
                for (k = rps->m_numberOfPictures - 1; k > rps->m_numberOfPictures - rps->num_long_term_pic - 1; k--) {
                    if (find_matching_ltrp(slice, &ltrpIndex, rps->poc[k], rps->m_used[k])) {
                        ltrpInSPS[numLtrpInSPS] = ltrpIndex;
                        numLtrpInSPS++;
                    } else {
                        counter++;
                    }
                }

                numLtrpInSH -= rps->m_numberOfPictures - rps->num_long_term_pic;

                RK_S32 bitsForLtrpInSPS = 0;
                while (slice->m_sps->m_numLongTermRefPicSPS > (RK_U32)(1 << bitsForLtrpInSPS)) {
                    bitsForLtrpInSPS++;
                }

                if (slice->m_sps->m_numLongTermRefPicSPS > 0) {
                    mpp_writer_put_ue(bitIf, numLtrpInSPS);
                }
                mpp_writer_put_ue(bitIf, numLtrpInSH);
                // Note that the LSBs of the LT ref. pic. POCs must be sorted before.
                // Not sorted here because LT ref indices will be used in setRefPicList()
                RK_S32 prevDeltaMSB = 0;
                RK_S32 offset = rps->num_negative_pic + rps->num_positive_pic;
                for ( k = rps->m_numberOfPictures - 1; k > offset - 1; k--) {
                    if (counter < numLtrpInSPS) {
                        if (bitsForLtrpInSPS > 0) {
                            mpp_writer_put_bits(bitIf, ltrpInSPS[counter], bitsForLtrpInSPS);
                        }
                    } else {
                        mpp_writer_put_bits(bitIf, rps->m_pocLSBLT[k], slice->m_sps->m_bitsForPOC);
                        mpp_writer_put_bits(bitIf, rps->m_used[k], 1);
                    }
                    mpp_writer_put_bits(bitIf, rps->m_deltaPocMSBPresentFlag[k], 1);

                    if (rps->m_deltaPocMSBPresentFlag[k]) {
                        RK_U32 deltaFlag = 0;
                        if ((k == rps->m_numberOfPictures - 1) || (k == rps->m_numberOfPictures - 1 - numLtrpInSPS)) {
                            deltaFlag = 1;
                        }
                        if (deltaFlag) {
                            mpp_writer_put_ue(bitIf, rps->m_deltaPOCMSBCycleLT[k]);
                        } else {
                            RK_S32 differenceInDeltaMSB = rps->m_deltaPOCMSBCycleLT[k] - prevDeltaMSB;
                            mpp_writer_put_ue(bitIf, differenceInDeltaMSB);
                        }
                        prevDeltaMSB = rps->m_deltaPOCMSBCycleLT[k];
                    }
                }
            }
            if (slice->m_sps->m_TMVPFlagsPresent) {
                mpp_writer_put_bits(bitIf, slice->m_enableTMVPFlag ? 1 : 0, 1);
            }
        }

        if (slice->m_sps->m_bUseSAO) { //skip frame close sao
            mpp_writer_put_bits(bitIf, 0, 1);
            mpp_writer_put_bits(bitIf, 0, 1);

        }
        //check if numrefidxes match the defaults. If not, override

        if (slice->m_sliceType != I_SLICE) {
            RK_U32 overrideFlag = (slice->m_numRefIdx[0] != (RK_S32)slice->m_pps->m_numRefIdxL0DefaultActive);
            mpp_writer_put_bits(bitIf, overrideFlag ? 1 : 0, 1);
            if (overrideFlag) {
                mpp_writer_put_ue(bitIf, slice->m_numRefIdx[0] - 1);
                slice->m_numRefIdx[1] = 0;
            }
        }

        if (slice->m_pps->m_listsModificationPresentFlag && get_num_rps_cur_templist(rps) > 1) {
            H265eRefPicListModification* refPicListModification = &slice->m_RefPicListModification;
            mpp_writer_put_bits(bitIf, refPicListModification->m_refPicListModificationFlagL0 ? 1 : 0, 1);
            if (refPicListModification->m_refPicListModificationFlagL0) {
                RK_S32 numRpsCurrTempList0 = get_num_rps_cur_templist(rps);
                if (numRpsCurrTempList0 > 1) {
                    RK_S32 length = 1;
                    numRpsCurrTempList0--;
                    while (numRpsCurrTempList0 >>= 1) {
                        length++;
                    }
                    for (i = 0; i < (RK_U32)slice->m_numRefIdx[0]; i++) {
                        mpp_writer_put_bits(bitIf, refPicListModification->m_RefPicSetIdxL0[i], length);
                    }
                }
            }
        }

        if (slice->m_pps->m_cabacInitPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_cabacInitFlag, 1);
        }

        if (slice->m_enableTMVPFlag) {

            if (slice->m_sliceType != I_SLICE &&
                ((slice->m_colFromL0Flag == 1 && slice->m_numRefIdx[0] > 1) ||
                 (slice->m_colFromL0Flag == 0 && slice->m_numRefIdx[1] > 1))) {
                mpp_writer_put_ue(bitIf, slice->m_colRefIdx);
            }
        }

        if (slice->m_sliceType != I_SLICE) {
            RK_S32 flag = MRG_MAX_NUM_CANDS - slice->m_maxNumMergeCand;
            flag = flag == 5 ? 4 : flag;
            mpp_writer_put_ue(bitIf, flag);
        }
        RK_S32 code = slice->m_sliceQp - (slice->m_pps->m_picInitQPMinus26 + 26);
        mpp_writer_put_se(bitIf, code);
        if (slice->m_pps->m_bSliceChromaQpFlag) {
            code = slice->m_sliceQpDeltaCb;
            mpp_writer_put_se(bitIf, code);
            code = slice->m_sliceQpDeltaCr;
            mpp_writer_put_se(bitIf, code);
        }
        if (slice->m_pps->m_deblockingFilterControlPresentFlag) {
            if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterOverrideFlag, 1);
            }
            if (slice->m_deblockingFilterOverrideFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterDisable, 1);
                if (!slice->m_deblockingFilterDisable) {
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterBetaOffsetDiv2);
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterTcOffsetDiv2);
                }
            }
        }
    }
    if (slice->m_pps->m_tiles_enabled_flag) {
        mpp_writer_put_ue(bitIf, 0);    // num_entry_point_offsets
    }
    if (slice->m_pps->m_sliceHeaderExtensionPresentFlag) {
        mpp_writer_put_ue(bitIf, slice->slice_header_extension_length);
        for (i = 0; i < slice->slice_header_extension_length; i++) {
            mpp_writer_put_bits(bitIf, 0, 8);
        }
    }
    h265e_dbg_func("leave\n");
}